

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionWriter.hpp
# Opt level: O3

bool __thiscall
binlog::SessionWriter::
addEvent<std::map<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>const&>
          (SessionWriter *this,uint64_t eventSourceId,uint64_t clock,
          map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *args)

{
  ulong minQueueCapacity;
  QueueWriter *this_00;
  char **ppcVar1;
  undefined4 uVar2;
  char *pcVar3;
  Queue *pQVar4;
  _Rb_tree_node_base *p_Var5;
  size_t sVar6;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *__range3;
  long lVar7;
  
  p_Var5 = (args->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  lVar7 = 0x14;
  while ((_Rb_tree_header *)p_Var5 != &(args->_M_t)._M_impl.super__Rb_tree_header) {
    p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
    lVar7 = lVar7 + 8;
  }
  minQueueCapacity = lVar7 + 4;
  this_00 = &this->_qw;
  if (((((ulong)((long)(this->_qw)._writeEnd - (long)(this->_qw)._writePos) < minQueueCapacity) &&
       (sVar6 = detail::QueueWriter::maximizeWriteCapacity(this_00), sVar6 < minQueueCapacity)) &&
      (replaceChannel(this,minQueueCapacity),
      (ulong)((long)(this->_qw)._writeEnd - (long)(this->_qw)._writePos) < minQueueCapacity)) &&
     (sVar6 = detail::QueueWriter::maximizeWriteCapacity(this_00), sVar6 < minQueueCapacity)) {
    return false;
  }
  *(int *)(this->_qw)._writePos = (int)lVar7;
  pcVar3 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar3 + 4;
  *(uint64_t *)(pcVar3 + 4) = eventSourceId;
  pcVar3 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar3 + 8;
  *(uint64_t *)(pcVar3 + 8) = clock;
  pcVar3 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar3 + 8;
  uVar2 = (undefined4)(args->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  *(undefined4 *)(pcVar3 + 8) = uVar2;
  ppcVar1 = &(this->_qw)._writePos;
  *ppcVar1 = *ppcVar1 + 4;
  mserialize::detail::
  BuiltinSerializer<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_void>
  ::serialize_elems<binlog::detail::QueueWriter>(args,uVar2,this_00);
  pQVar4 = (this->_qw)._queue;
  (pQVar4->writeIndex).super___atomic_base<unsigned_long>._M_i =
       (long)(this->_qw)._writePos - (long)pQVar4->buffer;
  return true;
}

Assistant:

bool SessionWriter::addEvent(std::uint64_t eventSourceId, std::uint64_t clock, Args&&... args) noexcept
{
  // compute size (excludes size field)
  std::size_t size = 0;
  const std::size_t sizes[] = {sizeof(eventSourceId), sizeof(clock), mserialize::serialized_size(args)...};
  for (auto s : sizes) { size += s; }

  // allocate space (totalSize includes size field)
  const std::size_t totalSize = size + sizeof(std::uint32_t);
  if (! _qw.beginWrite(totalSize))
  {
    // not enough space in queue, create a new channel
    replaceChannel(totalSize);
    if (! _qw.beginWrite(totalSize)) { return false; }
  }

  // serialize fields
  using swallow = int[];
  (void)swallow{
    (mserialize::serialize(std::uint32_t(size), _qw), int{}),
    (mserialize::serialize(eventSourceId, _qw), int{}),
    (mserialize::serialize(clock, _qw), int{}),
    (mserialize::serialize(args, _qw), int{})...
  };

  _qw.endWrite();
  return true;
}